

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O0

void __thiscall QLayout::addChildWidget(QLayout *this,QWidget *w)

{
  bool bVar1;
  QWidget *pQVar2;
  QWidget *pQVar3;
  QWidgetPrivate *li;
  bool needShow;
  QLayout *l;
  QWidget *pw;
  QWidget *mw;
  byte local_41;
  QWidgetPrivate *in_stack_ffffffffffffffc0;
  QWidget *in_stack_ffffffffffffffc8;
  ConnectionType c;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  QWidgetPrivate *in_stack_ffffffffffffffd8;
  
  pQVar2 = parentWidget((QLayout *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
  pQVar3 = QWidget::parentWidget((QWidget *)0x33c49b);
  if (((pQVar3 != (QWidget *)0x0) &&
      (bVar1 = QWidget::testAttribute
                         (in_stack_ffffffffffffffc8,
                          (WidgetAttribute)((ulong)in_stack_ffffffffffffffc0 >> 0x20)), bVar1)) &&
     (li = (QWidgetPrivate *)QWidget::layout((QWidget *)0x33c4c7), in_stack_ffffffffffffffd8 = li,
     li != (QWidgetPrivate *)0x0)) {
    in_stack_ffffffffffffffc8 = (QWidget *)0x0;
    if (li != (QWidgetPrivate *)0x0) {
      in_stack_ffffffffffffffc8 = (QWidget *)&li->field_0x10;
    }
    removeWidgetRecursively
              ((QLayoutItem *)li,
               (QObject *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
    in_stack_ffffffffffffffc0 = li;
  }
  c = (ConnectionType)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if (((pQVar3 != (QWidget *)0x0) && (pQVar2 != (QWidget *)0x0)) && (pQVar3 != pQVar2)) {
    pQVar3 = (QWidget *)0x0;
  }
  local_41 = 0;
  if (pQVar2 != (QWidget *)0x0) {
    bVar1 = QWidget::isVisible((QWidget *)0x33c54f);
    local_41 = 0;
    if (bVar1) {
      QWidgetPrivate::get((QWidget *)0x33c568);
      bVar1 = QWidgetPrivate::isExplicitlyHidden(in_stack_ffffffffffffffc0);
      local_41 = bVar1 ^ 0xff;
    }
  }
  local_41 = local_41 & 1;
  if ((pQVar3 == (QWidget *)0x0) && (pQVar2 != (QWidget *)0x0)) {
    QWidget::setParent((QWidget *)0x0,(QWidget *)in_stack_ffffffffffffffd8);
  }
  QWidget::setAttribute(pw,l._4_4_,l._3_1_);
  if ((local_41 & 1) != 0) {
    QMetaObject::invokeMethod<>
              ((QObject *)in_stack_ffffffffffffffd8,
               (char *)CONCAT17(local_41,in_stack_ffffffffffffffd0),c);
  }
  return;
}

Assistant:

void QLayout::addChildWidget(QWidget *w)
{
    QWidget *mw = parentWidget();
    QWidget *pw = w->parentWidget();

    //Qt::WA_LaidOut is never reset. It only means that the widget at some point has
    //been in a layout.
    if (pw && w->testAttribute(Qt::WA_LaidOut)) {
        QLayout *l = pw->layout();
        if (l && removeWidgetRecursively(l, w)) {
#ifdef QT_DEBUG
            if (Q_UNLIKELY(layoutDebug()))
                qWarning("QLayout::addChildWidget: %s \"%ls\" is already in a layout; moved to new layout",
                         w->metaObject()->className(), qUtf16Printable(w->objectName()));
#endif
        }
    }
    if (pw && mw && pw != mw) {
#ifdef QT_DEBUG
            if (Q_UNLIKELY(layoutDebug()))
                qWarning("QLayout::addChildWidget: %s \"%ls\" in wrong parent; moved to correct parent",
                         w->metaObject()->className(), qUtf16Printable(w->objectName()));
#endif
        pw = nullptr;
    }
    bool needShow = mw && mw->isVisible() && !QWidgetPrivate::get(w)->isExplicitlyHidden();
    if (!pw && mw)
        w->setParent(mw);
    w->setAttribute(Qt::WA_LaidOut);
    if (needShow)
        QMetaObject::invokeMethod(w, "_q_showIfNotHidden", Qt::QueuedConnection); //show later
}